

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::ActivationParams::SerializeWithCachedSizes
          (ActivationParams *this,CodedOutputStream *output)

{
  if (this->_oneof_case_[0] == 5) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (5,&((this->NonlinearityType_).linear_)->super_MessageLite,output);
  }
  if (this->_oneof_case_[0] == 10) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (10,&((this->NonlinearityType_).linear_)->super_MessageLite,output);
  }
  if (this->_oneof_case_[0] == 0xf) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0xf,&((this->NonlinearityType_).linear_)->super_MessageLite,output);
  }
  if (this->_oneof_case_[0] == 0x14) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x14,&((this->NonlinearityType_).linear_)->super_MessageLite,output);
  }
  if (this->_oneof_case_[0] == 0x19) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x19,&((this->NonlinearityType_).linear_)->super_MessageLite,output);
  }
  if (this->_oneof_case_[0] == 0x1e) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x1e,&((this->NonlinearityType_).linear_)->super_MessageLite,output);
  }
  if (this->_oneof_case_[0] == 0x1f) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x1f,&((this->NonlinearityType_).linear_)->super_MessageLite,output);
  }
  if (this->_oneof_case_[0] == 0x28) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x28,&((this->NonlinearityType_).linear_)->super_MessageLite,output);
  }
  if (this->_oneof_case_[0] == 0x29) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x29,&((this->NonlinearityType_).linear_)->super_MessageLite,output);
  }
  if (this->_oneof_case_[0] == 0x32) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x32,&((this->NonlinearityType_).linear_)->super_MessageLite,output);
  }
  if (this->_oneof_case_[0] == 0x3c) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x3c,&((this->NonlinearityType_).linear_)->super_MessageLite,output);
  }
  if (this->_oneof_case_[0] == 0x46) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x46,&((this->NonlinearityType_).linear_)->super_MessageLite,output);
  }
  if (this->_oneof_case_[0] == 0x47) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x47,&((this->NonlinearityType_).linear_)->super_MessageLite,output);
    return;
  }
  return;
}

Assistant:

void ActivationParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.ActivationParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.ActivationLinear linear = 5;
  if (has_linear()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      5, *NonlinearityType_.linear_, output);
  }

  // .CoreML.Specification.ActivationReLU ReLU = 10;
  if (has_relu()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      10, *NonlinearityType_.relu_, output);
  }

  // .CoreML.Specification.ActivationLeakyReLU leakyReLU = 15;
  if (has_leakyrelu()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      15, *NonlinearityType_.leakyrelu_, output);
  }

  // .CoreML.Specification.ActivationThresholdedReLU thresholdedReLU = 20;
  if (has_thresholdedrelu()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      20, *NonlinearityType_.thresholdedrelu_, output);
  }

  // .CoreML.Specification.ActivationPReLU PReLU = 25;
  if (has_prelu()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      25, *NonlinearityType_.prelu_, output);
  }

  // .CoreML.Specification.ActivationTanh tanh = 30;
  if (has_tanh()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      30, *NonlinearityType_.tanh_, output);
  }

  // .CoreML.Specification.ActivationScaledTanh scaledTanh = 31;
  if (has_scaledtanh()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      31, *NonlinearityType_.scaledtanh_, output);
  }

  // .CoreML.Specification.ActivationSigmoid sigmoid = 40;
  if (has_sigmoid()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      40, *NonlinearityType_.sigmoid_, output);
  }

  // .CoreML.Specification.ActivationSigmoidHard sigmoidHard = 41;
  if (has_sigmoidhard()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      41, *NonlinearityType_.sigmoidhard_, output);
  }

  // .CoreML.Specification.ActivationELU ELU = 50;
  if (has_elu()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      50, *NonlinearityType_.elu_, output);
  }

  // .CoreML.Specification.ActivationSoftsign softsign = 60;
  if (has_softsign()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      60, *NonlinearityType_.softsign_, output);
  }

  // .CoreML.Specification.ActivationSoftplus softplus = 70;
  if (has_softplus()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      70, *NonlinearityType_.softplus_, output);
  }

  // .CoreML.Specification.ActivationParametricSoftplus parametricSoftplus = 71;
  if (has_parametricsoftplus()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      71, *NonlinearityType_.parametricsoftplus_, output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.ActivationParams)
}